

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_solve_ab(REF_INT rows,REF_INT cols,REF_DBL *ab)

{
  REF_DBL RVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  double local_b0;
  double local_a0;
  double local_98;
  double local_90;
  double local_80;
  double local_78;
  REF_DBL local_70;
  REF_DBL RStack_60;
  REF_BOOL ill_condition;
  REF_DBL rhs;
  REF_DBL factor;
  REF_DBL temp;
  REF_DBL pivot;
  REF_DBL largest_pivot;
  REF_INT pivot_row;
  REF_INT k;
  REF_INT j;
  REF_INT i;
  REF_INT col;
  REF_INT row;
  REF_DBL *ab_local;
  REF_INT cols_local;
  REF_INT rows_local;
  
  bVar3 = false;
  for (j = 0; iVar4 = rows, j < rows; j = j + 1) {
    largest_pivot._0_4_ = j;
    if (ab[j + rows * j] <= 0.0) {
      local_70 = -ab[j + rows * j];
    }
    else {
      local_70 = ab[j + rows * j];
    }
    pivot = local_70;
    k = j;
    while (k = k + 1, k < rows) {
      if (ab[k + rows * j] <= 0.0) {
        local_78 = -ab[k + rows * j];
      }
      else {
        local_78 = ab[k + rows * j];
      }
      if (pivot < local_78) {
        pivot = local_78;
        largest_pivot._0_4_ = k;
      }
    }
    if (largest_pivot._0_4_ != j) {
      for (pivot_row = j; pivot_row < cols; pivot_row = pivot_row + 1) {
        RVar1 = ab[largest_pivot._0_4_ + pivot_row * rows];
        ab[largest_pivot._0_4_ + pivot_row * rows] = ab[j + pivot_row * rows];
        ab[j + pivot_row * rows] = RVar1;
      }
    }
    dVar2 = ab[j + rows * j];
    for (pivot_row = j; k = j, pivot_row < cols; pivot_row = pivot_row + 1) {
      if (dVar2 * 1e+20 <= 0.0) {
        local_80 = -(dVar2 * 1e+20);
      }
      else {
        local_80 = dVar2 * 1e+20;
      }
      if (ab[j + pivot_row * rows] <= 0.0) {
        local_90 = -ab[j + pivot_row * rows];
      }
      else {
        local_90 = ab[j + pivot_row * rows];
      }
      if (local_80 <= local_90) {
        return 4;
      }
      local_98 = dVar2;
      if (dVar2 <= 0.0) {
        local_98 = -dVar2;
      }
      if (local_98 < 1e-13) {
        bVar3 = true;
      }
      iVar4 = j + pivot_row * rows;
      ab[iVar4] = ab[iVar4] / dVar2;
    }
    while (k = k + 1, k < rows) {
      dVar2 = ab[k + j * rows];
      for (pivot_row = j; pivot_row < cols; pivot_row = pivot_row + 1) {
        iVar4 = k + pivot_row * rows;
        ab[iVar4] = -ab[j + pivot_row * rows] * dVar2 + ab[iVar4];
      }
    }
  }
  do {
    j = iVar4;
    if (cols <= j) {
      cols_local = 0;
      if (bVar3) {
        cols_local = 8;
      }
      return cols_local;
    }
    for (i = rows + -1; -1 < i; i = i + -1) {
      RStack_60 = ab[i + j * rows];
      largest_pivot._4_4_ = i;
      while (largest_pivot._4_4_ = largest_pivot._4_4_ + 1, largest_pivot._4_4_ < rows) {
        RStack_60 = -ab[i + largest_pivot._4_4_ * rows] * ab[largest_pivot._4_4_ + j * rows] +
                    RStack_60;
      }
      if (ab[i + i * rows] * 1e+20 <= 0.0) {
        local_a0 = -(ab[i + i * rows] * 1e+20);
      }
      else {
        local_a0 = ab[i + i * rows] * 1e+20;
      }
      if (RStack_60 <= 0.0) {
        local_b0 = -RStack_60;
      }
      else {
        local_b0 = RStack_60;
      }
      if (local_a0 <= local_b0) {
        return 4;
      }
      ab[i + j * rows] = RStack_60 / ab[i + i * rows];
    }
    iVar4 = j + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_matrix_solve_ab(REF_INT rows, REF_INT cols,
                                       REF_DBL *ab) {
  REF_INT row, col;
  REF_INT i, j, k;
  REF_INT pivot_row;
  REF_DBL largest_pivot, pivot;
  REF_DBL temp;
  REF_DBL factor;
  REF_DBL rhs;
  REF_BOOL ill_condition = REF_FALSE;

  for (col = 0; col < rows; col++) {
    /* find largest pivot */
    pivot_row = col;
    largest_pivot = ABS(ab[pivot_row + rows * col]);
    for (i = col + 1; i < rows; i++) {
      pivot = ABS(ab[i + rows * col]);
      if (pivot > largest_pivot) {
        largest_pivot = pivot;
        pivot_row = i;
      }
    }

    /* exchange rows to get the best pivot on the diagonal,
       unless it is already there */
    if (pivot_row != col)
      for (j = col; j < cols; j++) {
        temp = ab[pivot_row + j * rows];
        ab[pivot_row + j * rows] = ab[col + j * rows];
        ab[col + j * rows] = temp;
      }

    /* normalize pivot row */
    pivot = ab[col + rows * col];
    for (j = col; j < cols; j++) {
      if (!ref_math_divisible(ab[col + j * rows], pivot)) {
        return REF_DIV_ZERO;
      }
      if (ABS(pivot) < 1.0e-13) {
        ill_condition = REF_TRUE;
      }
      ab[col + j * rows] /= pivot;
    }

    /* eliminate sub diagonal terms */
    for (i = col + 1; i < rows; i++) {
      factor = ab[i + col * rows];
      for (j = col; j < cols; j++)
        ab[i + j * rows] -= ab[col + j * rows] * factor;
    }
  }

  for (col = rows; col < cols; col++)
    for (row = rows - 1; row > -1; row--) {
      rhs = ab[row + col * rows];
      for (k = row + 1; k < rows; k++)
        rhs -= ab[row + k * rows] * ab[k + col * rows];
      if (!ref_math_divisible(rhs, ab[row + row * rows])) return REF_DIV_ZERO;
      ab[row + col * rows] = rhs / ab[row + row * rows];
    }

  return (ill_condition ? REF_ILL_CONDITIONED : REF_SUCCESS);
}